

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 MemBackendFree(SyMemBackend *pBackend,void *pChunk)

{
  SyMemBlock *pSVar1;
  SyMemBlock *pBlock;
  void *pChunk_local;
  SyMemBackend *pBackend_local;
  
  pSVar1 = (SyMemBlock *)((long)pChunk + -0x10);
  if (pBackend->nBlock != 0) {
    if (pBackend->pBlocks == pSVar1) {
      pBackend->pBlocks = pBackend->pBlocks->pNext;
    }
    if (*(long *)((long)pChunk + -8) != 0) {
      **(undefined8 **)((long)pChunk + -8) = pSVar1->pNext;
    }
    if (pSVar1->pNext != (SyMemBlock *)0x0) {
      pSVar1->pNext->pPrev = *(SyMemBlock **)((long)pChunk + -8);
    }
    pBackend->nBlock = pBackend->nBlock - 1;
    (*pBackend->pMethods->xFree)(pSVar1);
  }
  return 0;
}

Assistant:

static sxi32 MemBackendFree(SyMemBackend *pBackend, void * pChunk)
{
	SyMemBlock *pBlock;
	pBlock = (SyMemBlock *)(((char *)pChunk) - sizeof(SyMemBlock));
#if defined(UNTRUST)
	if( pBlock->nGuard != SXMEM_BACKEND_MAGIC ){
		return SXERR_CORRUPT;
	}
#endif
	/* Unlink from the list of active blocks */
	if( pBackend->nBlock > 0 ){
		/* Release the block */
#if defined(UNTRUST)
		/* Mark as stale block */
		pBlock->nGuard = 0x635B;
#endif
		MACRO_LD_REMOVE(pBackend->pBlocks, pBlock);
		pBackend->nBlock--;
		pBackend->pMethods->xFree(pBlock);
	}
	return SXRET_OK;
}